

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O2

sequence * toml::detail::syntax::std_table(sequence *__return_storage_ptr__,spec *s)

{
  character local_90;
  repeat_at_least local_80;
  repeat_at_least local_68;
  key local_50;
  character local_28;
  
  local_90.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004cc8e0;
  local_90.value_ = '[';
  ws(&local_68,s);
  key::key(&local_50,s);
  ws(&local_80,s);
  local_28.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004cc8e0;
  local_28.value_ = ']';
  sequence::
  sequence<toml::detail::character,toml::detail::repeat_at_least,toml::detail::syntax::key,toml::detail::repeat_at_least,toml::detail::character>
            (__return_storage_ptr__,&local_90,&local_68,&local_50,&local_80,&local_28);
  if ((_Head_base<0UL,_toml::detail::scanner_base_*,_false>)
      local_80.other_.scanner_._M_t.
      super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
      ._M_t.
      super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
      .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
      (_Head_base<0UL,_toml::detail::scanner_base_*,_false>)0x0) {
    (*(*(_func_int ***)
        local_80.other_.scanner_._M_t.
        super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
        ._M_t.
        super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
        .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl)[1])();
  }
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_50.scanner_.others_);
  if (local_68.other_.scanner_._M_t.
      super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
      ._M_t.
      super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
      .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
      (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
       )0x0) {
    (*(*(_func_int ***)
        local_68.other_.scanner_._M_t.
        super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
        ._M_t.
        super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
        .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl)[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE sequence std_table(const spec& s)
{
    return sequence(character('['), ws(s), key(s), ws(s), character(']'));
}